

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O3

int Nwk_ManPushForwardBot_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  int iVar2;
  Nwk_Obj_t *pObj_00;
  int iVar3;
  long lVar4;
  
  iVar1 = pObj->TravId;
  iVar2 = pObj->pMan->nTravIds;
  iVar3 = iVar2 + -2;
  if (iVar1 == iVar2 || iVar3 == iVar1) {
    return 0;
  }
  if ((iVar3 <= iVar1) && (iVar3 = iVar2, iVar1 != iVar2 + -1)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFlow.c"
                  ,0x49,"void Nwk_ObjSetVisitedBot(Nwk_Obj_t *)");
  }
  pObj->TravId = iVar3;
  if ((pObj->field_0x20 & 0x20) == 0) {
    iVar3 = Nwk_ManPushForwardTop_rec(pObj,pObj);
    if (iVar3 != 0) {
      pObj->field_0x20 = pObj->field_0x20 | 0x20;
LAB_00499d29:
      pObj->pCopy = pPred;
      return 1;
    }
  }
  else {
    pObj_00 = (Nwk_Obj_t *)pObj->pCopy;
    if ((pObj_00 != (Nwk_Obj_t *)0x0) &&
       (iVar3 = Nwk_ManPushForwardTop_rec(pObj_00,pObj_00), iVar3 != 0)) goto LAB_00499d29;
  }
  if (0 < pObj->nFanins) {
    lVar4 = 0;
    do {
      if (pObj->pFanio[lVar4] == (Nwk_Obj_t *)0x0) {
        return 0;
      }
      iVar3 = Nwk_ManPushForwardBot_rec(pObj->pFanio[lVar4],pPred);
      if (iVar3 != 0) {
        return 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pObj->nFanins);
  }
  return 0;
}

Assistant:

int Nwk_ManPushForwardBot_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjVisitedBot(pObj) )
        return 0;
    Nwk_ObjSetVisitedBot(pObj);
    // propagate through the internal edge
    if ( Nwk_ObjHasFlow(pObj) )
    {
        if ( Nwk_ObjPred(pObj) )
            if ( Nwk_ManPushForwardTop_rec( Nwk_ObjPred(pObj), Nwk_ObjPred(pObj) ) )
                return Nwk_ObjSetPred( pObj, pPred ); 
    }
    else if ( Nwk_ManPushForwardTop_rec(pObj, pObj) )
    {
        Nwk_ObjSetFlow( pObj );
        return Nwk_ObjSetPred( pObj, pPred );
    }
    // try to push through the fanins
    Nwk_ObjForEachFanin( pObj, pNext, i )
        if ( Nwk_ManPushForwardBot_rec( pNext, pPred ) )
            return 1;
    return 0;
}